

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseElementEnd(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlNodePtr node;
  xmlParserInputPtr pxVar2;
  xmlParserNodeInfo *pxVar3;
  xmlChar *pxVar4;
  int in_ESI;
  
  if ((long)ctxt->nameNr < 1) {
    pxVar2 = ctxt->input;
    pxVar4 = pxVar2->cur;
    if ((*pxVar4 == '<') && (pxVar4[1] == '/')) {
      pxVar2->cur = pxVar4 + 2;
      pxVar2->col = pxVar2->col + 2;
      if (pxVar4[2] == '\0') {
        xmlParserGrow(ctxt);
        return;
      }
    }
  }
  else {
    node = ctxt->node;
    if (ctxt->sax2 == 0) {
      xmlParseEndTag1(ctxt,in_ESI);
    }
    else {
      xmlParseEndTag2(ctxt,ctxt->pushTab + (long)ctxt->nameNr + -1);
      iVar1 = ctxt->nameNr;
      if (0 < (long)iVar1) {
        ctxt->nameNr = iVar1 - 1U;
        if (iVar1 == 1) {
          pxVar4 = (xmlChar *)0x0;
        }
        else {
          pxVar4 = ctxt->nameTab[(long)iVar1 + -2];
        }
        ctxt->name = pxVar4;
        ctxt->nameTab[iVar1 - 1U] = (xmlChar *)0x0;
      }
    }
    if ((node != (xmlNodePtr)0x0) && (ctxt->record_info != 0)) {
      pxVar3 = xmlParserFindNodeInfo(ctxt,node);
      if (pxVar3 != (xmlParserNodeInfo *)0x0) {
        pxVar2 = ctxt->input;
        pxVar3->end_pos = (unsigned_long)(pxVar2->cur + (pxVar2->consumed - (long)pxVar2->base));
        pxVar3->end_line = (long)pxVar2->line;
      }
    }
  }
  return;
}

Assistant:

static void
xmlParseElementEnd(xmlParserCtxtPtr ctxt) {
    xmlNodePtr cur = ctxt->node;

    if (ctxt->nameNr <= 0) {
        if ((RAW == '<') && (NXT(1) == '/'))
            SKIP(2);
        return;
    }

    /*
     * parse the end of tag: '</' should be here.
     */
    if (ctxt->sax2) {
	xmlParseEndTag2(ctxt, &ctxt->pushTab[ctxt->nameNr - 1]);
	namePop(ctxt);
    }
#ifdef LIBXML_SAX1_ENABLED
    else
	xmlParseEndTag1(ctxt, 0);
#endif /* LIBXML_SAX1_ENABLED */

    /*
     * Capture end position
     */
    if (cur != NULL && ctxt->record_info) {
        xmlParserNodeInfoPtr node_info;

        node_info = (xmlParserNodeInfoPtr) xmlParserFindNodeInfo(ctxt, cur);
        if (node_info != NULL) {
            node_info->end_pos = ctxt->input->consumed +
                                 (CUR_PTR - ctxt->input->base);
            node_info->end_line = ctxt->input->line;
        }
    }
}